

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_conjunction.cpp
# Opt level: O1

unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true> __thiscall
duckdb::ExpressionExecutor::InitializeState
          (ExpressionExecutor *this,BoundConjunctionExpression *expr,ExpressionExecutorState *root)

{
  pointer puVar1;
  ConjunctionState *this_00;
  pointer pCVar2;
  type child_expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer this_01;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::ConjunctionState_*,_false> local_30;
  
  this_00 = (ConjunctionState *)operator_new(0xb8);
  ConjunctionState::ConjunctionState(this_00,&expr->super_Expression,root);
  this_01 = (expr->children).
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (expr->children).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_30._M_head_impl = this_00;
  if (this_01 != puVar1) {
    do {
      pCVar2 = unique_ptr<duckdb::ConjunctionState,_std::default_delete<duckdb::ConjunctionState>,_true>
               ::operator->((unique_ptr<duckdb::ConjunctionState,_std::default_delete<duckdb::ConjunctionState>,_true>
                             *)&local_30);
      child_expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(this_01);
      ExpressionState::AddChild(&pCVar2->super_ExpressionState,child_expr);
      this_01 = this_01 + 1;
    } while (this_01 != puVar1);
  }
  pCVar2 = unique_ptr<duckdb::ConjunctionState,_std::default_delete<duckdb::ConjunctionState>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionState,_std::default_delete<duckdb::ConjunctionState>,_true>
                         *)&local_30);
  ExpressionState::Finalize(&pCVar2->super_ExpressionState);
  (this->expressions).
  super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
  super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_30._M_head_impl;
  return (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
         (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)this;
}

Assistant:

unique_ptr<ExpressionState> ExpressionExecutor::InitializeState(const BoundConjunctionExpression &expr,
                                                                ExpressionExecutorState &root) {
	auto result = make_uniq<ConjunctionState>(expr, root);
	for (auto &child : expr.children) {
		result->AddChild(*child);
	}

	result->Finalize();
	return std::move(result);
}